

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_forloop(function *fn,int A,int pc,int pc1)

{
  int pc1_local;
  int pc_local;
  int A_local;
  function *fn_local;
  
  membuff_add_fstring(&fn->body,"if (intloop_%d) {\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body," i_%d += step_%d;\n",(ulong)(uint)A,(ulong)(uint)A);
  membuff_add_fstring(&fn->body,"  if ((0 < step_%d) ? (i_%d <= limit_%d) : (limit_%d <= i_%d)) {\n"
                      ,(ulong)(uint)A,(ulong)(uint)A,(ulong)(uint)A,(ulong)(uint)A,A);
  membuff_add_fstring(&fn->body,"   ra = R(%d);\n   setivalue(ra, i_%d);\n   goto Lbc_%d;\n",
                      (ulong)(A + 3),(ulong)(uint)A,(ulong)(uint)pc);
  membuff_add_string(&fn->body,"  }\n");
  membuff_add_string(&fn->body,"}\n");
  membuff_add_string(&fn->body,"else {\n");
  membuff_add_fstring(&fn->body," ninit_%d += nstep_%d;\n",(ulong)(uint)A,(ulong)(uint)A);
  membuff_add_fstring(&fn->body,
                      "  if ((0.0 < nstep_%d) ? (ninit_%d <= nlimit_%d) : (nlimit_%d <= ninit_%d)) {\n"
                      ,(ulong)(uint)A,(ulong)(uint)A,(ulong)(uint)A,(ulong)(uint)A,A);
  membuff_add_fstring(&fn->body,"   ra = R(%d);\n   setfltvalue(ra, ninit_%d);\n   goto Lbc_%d;\n",
                      (ulong)(A + 3),(ulong)(uint)A,(ulong)(uint)pc);
  membuff_add_string(&fn->body,"  }\n");
  membuff_add_string(&fn->body,"}\n");
  return;
}

Assistant:

static void emit_op_forloop(struct function *fn, int A, int pc, int pc1) {
  (void)pc1;
  membuff_add_fstring(&fn->body, "if (intloop_%d) {\n", A);
  membuff_add_fstring(&fn->body, " i_%d += step_%d;\n", A, A);
  membuff_add_fstring(&fn->body, "  if ((0 < step_%d) ? (i_%d <= limit_%d) : (limit_%d <= i_%d)) {\n", A, A, A, A, A);
  membuff_add_fstring(&fn->body, "   ra = R(%d);\n   setivalue(ra, i_%d);\n   goto Lbc_%d;\n", A + 3, A, pc);
  membuff_add_string(&fn->body, "  }\n");
  membuff_add_string(&fn->body, "}\n");
  membuff_add_string(&fn->body, "else {\n");
  membuff_add_fstring(&fn->body, " ninit_%d += nstep_%d;\n", A, A);
  membuff_add_fstring(&fn->body, "  if ((0.0 < nstep_%d) ? (ninit_%d <= nlimit_%d) : (nlimit_%d <= ninit_%d)) {\n", A,
                      A, A, A, A);
  membuff_add_fstring(&fn->body, "   ra = R(%d);\n   setfltvalue(ra, ninit_%d);\n   goto Lbc_%d;\n", A + 3, A, pc);
  membuff_add_string(&fn->body, "  }\n");
  membuff_add_string(&fn->body, "}\n");
}